

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

Test * SubprocessTestTokenNotAvailable::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x2d8);
  SubprocessTestTokenNotAvailable((SubprocessTestTokenNotAvailable *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(SubprocessTest, TokenNotAvailable) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  // simulate GNUmake jobserver pipe with 0 tokens
#ifdef _WIN32
  tokens_._token_available = false;
#else
  int fds[2];
  ASSERT_EQ(0u, pipe(fds));
  tokens_._fd = fds[0];
#endif

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    subprocs_.DoWork(&tokens_);
  }

#ifndef _WIN32
  close(fds[1]);
  close(fds[0]);
#endif

  EXPECT_FALSE(subprocs_.IsTokenAvailable());
  EXPECT_EQ(ExitSuccess, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());

  EXPECT_EQ(1u, subprocs_.finished_.size());
}